

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O0

int FIX::trailer_order::getOrderedPosition(int field)

{
  undefined4 local_c;
  int field_local;
  
  if (field == 0x59) {
    local_c = 2;
  }
  else if (field == 0x5d) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getOrderedPosition(const int field) {
    switch (field) {
    case FIELD::SignatureLength:
      return 1;
    case FIELD::Signature:
      return 2;
    default:
      return 0;
    };
  }